

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
::nosize_transfer_element(void *param_1)

{
  long *in_R8;
  moved_type mVar1;
  destroy_element_on_exit d;
  arrays_type *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffffb0;
  arrays_type *in_stack_ffffffffffffffb8;
  
  *in_R8 = *in_R8 + 1;
  position_for(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  mVar1 = flat_map_types<slang::BufferID,_unsigned_long>::move((element_type *)0x1986f3);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,unsigned_long>,256ul,16ul>>
  ::nosize_unchecked_emplace_at<std::pair<slang::BufferID&&,unsigned_long&&>>
            ((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
              *)param_1,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(size_t)mVar1.second,
             (pair<slang::BufferID_&&,_unsigned_long_&&> *)mVar1.first);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x198741);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }